

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void __thiscall
QWhatsThat::QWhatsThat(QWhatsThat *this,QString *txt,QWidget *parent,QWidget *showTextFor)

{
  QCursor *this_00;
  Data *pDVar1;
  QFont *pQVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  char cVar6;
  int iVar7;
  Data *pDVar8;
  QPalette *palette;
  QTextDocument *this_01;
  undefined8 uVar9;
  int extraout_EDX;
  uint uVar10;
  int extraout_EDX_00;
  int extraout_var;
  uint unaff_EBP;
  uint uVar11;
  int iVar12;
  long in_FS_OFFSET;
  double dVar13;
  double dVar14;
  QAnyStringView QVar15;
  undefined1 auVar16 [16];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  uint local_50;
  undefined4 local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x9);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007eccb0;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWhatsThat_007ece60;
  if (showTextFor == (QWidget *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else {
    pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&showTextFor->super_QObject);
  }
  (this->widget).wp.d = pDVar8;
  (this->widget).wp.value = &showTextFor->super_QObject;
  this->pressed = false;
  pDVar1 = (txt->d).d;
  (this->text).d.d = pDVar1;
  (this->text).d.ptr = (txt->d).ptr;
  (this->text).d.size = (txt->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->anchor).d.d = (Data *)0x0;
  (this->anchor).d.ptr = (char16_t *)0x0;
  (this->anchor).d.size = 0;
  if (instance != (QWhatsThat *)0x0) {
    (**(code **)(*(long *)&instance->super_QWidget + 0x20))();
  }
  instance = this;
  QWidget::setAttribute(&this->super_QWidget,WA_DeleteOnClose,true);
  QWidget::setAttribute(&this->super_QWidget,WA_NoSystemBackground,true);
  if (parent != (QWidget *)0x0) {
    palette = QWidget::palette(parent);
    QWidget::setPalette(&this->super_QWidget,palette);
  }
  QWidget::setAttribute(&this->super_QWidget,WA_MouseTracking,true);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  this_00 = (QCursor *)(local_60 + 8);
  QCursor::QCursor(this_00,ArrowCursor);
  QWidget::setCursor(&this->super_QWidget,this_00);
  QCursor::~QCursor(this_00);
  this->doc = (QTextDocument *)0x0;
  QWidget::ensurePolished(&this->super_QWidget);
  QVar15.m_size = (this->text).d.size | 0x8000000000000000;
  QVar15.field_0.m_data_utf16 = (this->text).d.ptr;
  cVar6 = Qt::mightBeRichText(QVar15);
  if (cVar6 == '\0') {
    QGuiApplication::primaryScreen();
    iVar7 = QScreen::virtualGeometry();
    uVar10 = (extraout_EDX - iVar7) + 1;
    unaff_EBP = 199;
    if (599 < (int)uVar10) {
      uVar10 = uVar10 / 3;
      uVar11 = 300;
      if (uVar10 < 300) {
        uVar11 = uVar10;
      }
      unaff_EBP = uVar11 - 1;
    }
    QFontMetrics::QFontMetrics((QFontMetrics *)local_60,&((this->super_QWidget).data)->fnt);
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_4c = 999;
    local_50 = unaff_EBP;
    uVar9 = QFontMetrics::boundingRect
                      ((QRect *)local_60,(int)local_60 + 8,(QString *)0x1421,(int)this + 0x40,
                       (int *)0x0);
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_60);
    iVar7 = extraout_EDX_00;
    iVar12 = extraout_var;
  }
  else {
    this_01 = (QTextDocument *)operator_new(0x10);
    uVar9 = 0;
    QTextDocument::QTextDocument(this_01,(QObject *)0x0);
    this->doc = this_01;
    QTextDocument::setUndoRedoEnabled(SUB81(this_01,0));
    pQVar2 = (QFont *)this->doc;
    QApplication::font((QApplication *)(local_60 + 8),&this->super_QWidget);
    QTextDocument::setDefaultFont(pQVar2);
    QFont::~QFont((QFont *)(local_60 + 8));
    QTextDocument::setHtml((QString *)this->doc);
    QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
    QTextDocument::adjustSize();
    auVar16 = QTextDocument::size();
    dVar14 = (double)((ulong)auVar16._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar16._0_8_;
    bVar3 = 2147483647.0 < dVar14;
    if (dVar14 <= -2147483648.0) {
      dVar14 = -2147483648.0;
    }
    dVar13 = (double)((ulong)auVar16._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar16._8_8_;
    bVar4 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    iVar7 = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar14) + -1;
    iVar12 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar13) + -1
    ;
  }
  plVar5 = QGuiApplicationPrivate::platform_theme;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              ((QVariant *)(local_60 + 8),QGuiApplicationPrivate::platform_theme,9);
    unaff_EBP = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)(local_60 + 8));
  }
  shadowWidth = 0;
  if ((unaff_EBP & 1) == 0) {
    shadowWidth = 6;
  }
  if (plVar5 == (long *)0x0) {
    shadowWidth = 6;
  }
  local_58._4_4_ = shadowWidth + (iVar12 - (int)((ulong)uVar9 >> 0x20)) + 0x11;
  local_58._0_4_ = (iVar7 - (int)uVar9) + shadowWidth + 0x19;
  QWidget::resize(&this->super_QWidget,(QSize *)(local_60 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThat::QWhatsThat(const QString& txt, QWidget* parent, QWidget *showTextFor)
    : QWidget(parent, Qt::Popup),
      widget(showTextFor), pressed(false), text(txt)
{
    delete instance;
    instance = this;
    setAttribute(Qt::WA_DeleteOnClose, true);
    setAttribute(Qt::WA_NoSystemBackground, true);
    if (parent)
        setPalette(parent->palette());
    setMouseTracking(true);
    setFocusPolicy(Qt::StrongFocus);
#ifndef QT_NO_CURSOR
    setCursor(Qt::ArrowCursor);
#endif
    QRect r;
    doc = nullptr;
    ensurePolished(); // Ensures style sheet font before size calc
    if (Qt::mightBeRichText(text)) {
        doc = new QTextDocument();
        doc->setUndoRedoEnabled(false);
        doc->setDefaultFont(QApplication::font(this));
#ifdef QT_NO_TEXTHTMLPARSER
        doc->setPlainText(text);
#else
        doc->setHtml(text);
#endif
        doc->setUndoRedoEnabled(false);
        doc->adjustSize();
        r.setTop(0);
        r.setLeft(0);
        r.setSize(doc->size().toSize());
    }
    else
    {
        int sw = QGuiApplication::primaryScreen()->virtualGeometry().width() / 3;
        if (sw < 200)
            sw = 200;
        else if (sw > 300)
            sw = 300;

        r = fontMetrics().boundingRect(0, 0, sw, 1000,
                                        Qt::AlignLeft | Qt::AlignTop
                                        | Qt::TextWordWrap | Qt::TextExpandTabs,
                                        text);
    }
    shadowWidth = dropShadow() ? 0 : 6;
    resize(r.width() + 2*hMargin + shadowWidth, r.height() + 2*vMargin + shadowWidth);
}